

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

void attr_counter_free(attr_counter **top)

{
  attr_counter *paVar1;
  attr_counter *tac;
  attr_counter *ac;
  attr_counter **top_local;
  
  if (*top != (attr_counter *)0x0) {
    tac = *top;
    while (tac != (attr_counter *)0x0) {
      paVar1 = tac->next;
      free(tac);
      tac = paVar1;
    }
    *top = (attr_counter *)0x0;
  }
  return;
}

Assistant:

static void
attr_counter_free(struct attr_counter **top)
{
	struct attr_counter *ac, *tac;

	if (*top == NULL)
		return;
	ac = *top;
        while (ac != NULL) {
		tac = ac->next;
		free(ac);
		ac = tac;
	}
	*top = NULL;
}